

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyNewLineNode(Lexer *lexer)

{
  Node *pNVar1;
  Node *node;
  Lexer *lexer_local;
  
  pNVar1 = prvTidyNewNode(lexer->allocator,lexer);
  pNVar1->start = lexer->lexsize;
  prvTidyAddCharToLexer(lexer,10);
  pNVar1->end = lexer->lexsize;
  return pNVar1;
}

Assistant:

Node *TY_(NewLineNode)( Lexer *lexer )
{
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    node->start = lexer->lexsize;
    TY_(AddCharToLexer)( lexer, (uint)'\n' );
    node->end = lexer->lexsize;
    return node;
}